

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::DepthRangeAPI::iterateHelper<float>(DepthRangeAPI *this,float *param_1)

{
  pointer *this_00;
  GLint GVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar6;
  value_type local_c8;
  int local_8c;
  int local_88;
  GLint i_3;
  GLint j_1;
  GLint j;
  float value;
  GLint i_2;
  GLint i_1;
  GLint i;
  vector<float,_std::allocator<float>_> depth_range_data_b;
  vector<float,_std::allocator<float>_> depth_range_data_a;
  GLint local_30;
  bool local_29;
  GLint max_viewports;
  bool test_result;
  DepthFuncWrapper depthFunc;
  Functions *gl;
  float *param_1_local;
  DepthRangeAPI *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  depthFunc.m_gl = (Functions *)CONCAT44(extraout_var,iVar3);
  Utils::DepthFuncWrapper::DepthFuncWrapper
            ((DepthFuncWrapper *)&max_viewports,(this->super_TestCaseBase).m_context);
  local_29 = true;
  local_30 = 0;
  (*(depthFunc.m_gl)->getIntegerv)(0x825b,&local_30);
  GVar4 = (*(depthFunc.m_gl)->getError)();
  glu::checkError(GVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x881);
  this_00 = &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)this_00);
  std::vector<float,_std::allocator<float>_>::vector((vector<float,_std::allocator<float>_> *)&i_1);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)this_00,(ulong)(uint)(local_30 * 2));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(uint)(local_30 * 2));
  getDepthRanges<float>
            (this,(DepthFuncWrapper *)&max_viewports,local_30,
             (vector<float,_std::allocator<float>_> *)
             &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  for (i_2 = 0; GVar1 = local_30, i_2 < local_30; i_2 = i_2 + 1) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)(i_2 << 1));
    *pvVar6 = *pvVar6 + 0.125;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(i_2 * 2 + 1));
    *pvVar6 = *pvVar6 - 0.125;
  }
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)
                      &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0);
  Utils::DepthFuncWrapper::depthRangeArray((DepthFuncWrapper *)&max_viewports,0,GVar1,pvVar6);
  GVar4 = (*(depthFunc.m_gl)->getError)();
  glu::checkError(GVar4,"depthRangeArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x897);
  getDepthRanges<float>
            (this,(DepthFuncWrapper *)&max_viewports,local_30,
             (vector<float,_std::allocator<float>_> *)&i_1);
  compareDepthRanges<float>
            (this,(vector<float,_std::allocator<float>_> *)
                  &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)&i_1,"depthRangeArray",&local_29);
  for (value = 0.0; (int)value < local_30; value = (float)((int)value + 1)) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(uint)((int)value * 2))
    ;
    *pvVar6 = 0.25;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)((int)value * 2 + 1));
    *pvVar6 = 0.75;
    Utils::DepthFuncWrapper::depthRangeIndexed
              ((DepthFuncWrapper *)&max_viewports,(GLuint)value,0.25,0.75);
    GVar4 = (*(depthFunc.m_gl)->getError)();
    glu::checkError(GVar4,"depthRangeIndexed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x8a7);
    getDepthRanges<float>
              (this,(DepthFuncWrapper *)&max_viewports,local_30,
               (vector<float,_std::allocator<float>_> *)
               &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    compareDepthRanges<float>
              (this,(vector<float,_std::allocator<float>_> *)
                    &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
               (vector<float,_std::allocator<float>_> *)&i_1,"depthRangeIndexed",&local_29);
  }
  for (j = 0; j < local_30; j = j + 1) {
    local_c8 = 1.0;
    if (j % 2 != 0) {
      local_c8 = 0.25;
    }
    for (i_3 = 0; local_88 = j, i_3 < j; i_3 = i_3 + 1) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(uint)(i_3 << 1));
      *pvVar6 = local_c8;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(i_3 * 2 + 1));
      *pvVar6 = local_c8;
    }
    while (GVar1 = local_30, local_88 = local_88 + 1, local_88 < local_30) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(uint)(local_88 * 2))
      ;
      *pvVar6 = local_c8;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i_1,(ulong)(local_88 * 2 + 1));
      *pvVar6 = local_c8;
    }
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&i_1,0);
    Utils::DepthFuncWrapper::depthRangeArray((DepthFuncWrapper *)&max_viewports,0,GVar1,pvVar6);
    GVar4 = (*(depthFunc.m_gl)->getError)();
    glu::checkError(GVar4,"depthRangeArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x8c3);
    getDepthRanges<float>
              (this,(DepthFuncWrapper *)&max_viewports,local_30,
               (vector<float,_std::allocator<float>_> *)
               &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    compareDepthRanges<float>
              (this,(vector<float,_std::allocator<float>_> *)
                    &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
               (vector<float,_std::allocator<float>_> *)&i_1,"depthRangeArray",&local_29);
  }
  for (local_8c = 0; local_8c < local_30; local_8c = local_8c + 1) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (ulong)(uint)(local_8c << 1));
    *pvVar6 = 0.0;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_8c * 2 + 1)
                       );
    *pvVar6 = 1.0;
  }
  Utils::DepthFuncWrapper::depthRange((DepthFuncWrapper *)&max_viewports,0.0,1.0);
  GVar4 = (*(depthFunc.m_gl)->getError)();
  glu::checkError(GVar4,"depthRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x8d4);
  getDepthRanges<float>
            (this,(DepthFuncWrapper *)&max_viewports,local_30,
             (vector<float,_std::allocator<float>_> *)&i_1);
  compareDepthRanges<float>
            (this,(vector<float,_std::allocator<float>_> *)
                  &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)&i_1,"depthRange",&local_29);
  bVar2 = local_29;
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&i_1)
  ;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &depth_range_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Utils::DepthFuncWrapper::~DepthFuncWrapper((DepthFuncWrapper *)&max_viewports);
  return (bool)(bVar2 & 1);
}

Assistant:

bool DepthRangeAPI::iterateHelper(T*)
{
	/* GL entry points */
	const glw::Functions&   gl = m_context.getRenderContext().getFunctions();
	Utils::DepthFuncWrapper depthFunc(m_context);

	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<T> depth_range_data_a;
	std::vector<T> depth_range_data_b;

	depth_range_data_a.resize(max_viewports * m_n_elements);
	depth_range_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial values of DEPTH_RANGE for all MAX_VIEWPORTS indices;
	 *   - change values of all indices at once with DepthRangeArrayv;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	getDepthRanges(depthFunc, max_viewports, depth_range_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] += 0.125;
		depth_range_data_a[i * m_n_elements + 1] -= 0.125;
	}

	depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);

	/*
	 *   - for each index:
	 *     * modify with DepthRangeIndexed,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_b[i * m_n_elements + 0] = 0.25;
		depth_range_data_b[i * m_n_elements + 1] = 0.75;

		depthFunc.depthRangeIndexed(i, (T)0.25, (T)0.75);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeIndexed");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with DepthRangeArrayv,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const T value = (0 == i % 2) ? T(1.0) : T(0.25);

		for (GLint j = 0; j < i; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);
	}

	/*
	 *   - change values of all indices at once with DepthRange;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] = 0.0f;
		depth_range_data_a[i * m_n_elements + 1] = 1.0f;
	}

	depthFunc.depthRange((T)0.0, (T)1.0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRange");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRange", test_result);

	return test_result;
}